

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image.h
# Opt level: O3

stbi__uint16 * stbi__convert_format16(stbi__uint16 *data,int img_n,int req_comp,uint x,uint y)

{
  ushort uVar1;
  stbi__uint16 sVar2;
  uint uVar3;
  stbi__uint16 *psVar4;
  int iVar5;
  stbi__uint16 *psVar6;
  ushort *puVar7;
  ulong uVar8;
  int iVar9;
  long lVar10;
  ulong uVar11;
  ulong uVar12;
  long in_FS_OFFSET;
  undefined1 auVar13 [16];
  
  psVar4 = data;
  if (req_comp != img_n) {
    if (3 < req_comp - 1U) {
      __assert_fail("req_comp >= 1 && req_comp <= 4",
                    "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinygltf/stb_image.h"
                    ,0x718,
                    "stbi__uint16 *stbi__convert_format16(stbi__uint16 *, int, int, unsigned int, unsigned int)"
                   );
    }
    psVar4 = (stbi__uint16 *)malloc((ulong)(req_comp * x * y * 2));
    if (psVar4 == (stbi__uint16 *)0x0) {
      free(data);
      *(char **)(in_FS_OFFSET + -0x20) = "outofmem";
      psVar4 = (stbi__uint16 *)0x0;
    }
    else {
      if (0 < (int)y) {
        uVar3 = req_comp + img_n * 8;
        if ((0x23 < uVar3) || ((0xe161a1c00U >> ((ulong)uVar3 & 0x3f) & 1) == 0)) {
          __assert_fail("0",
                        "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinygltf/stb_image.h"
                        ,0x735,
                        "stbi__uint16 *stbi__convert_format16(stbi__uint16 *, int, int, unsigned int, unsigned int)"
                       );
        }
        iVar5 = x - 1;
        uVar11 = 0;
        uVar12 = 0;
        uVar8 = 0;
        do {
          iVar9 = (int)uVar8 * x;
          if (uVar3 - 10 < 0x19) {
            puVar7 = data + (uint)(iVar9 * img_n);
            switch(uVar3) {
            case 10:
              if (-1 < iVar5) {
                lVar10 = 0;
                do {
                  psVar4[uVar12 + lVar10 * 2] = data[uVar11 + lVar10];
                  psVar4[uVar12 + lVar10 * 2 + 1] = 0xffff;
                  lVar10 = lVar10 + 1;
                } while (x != (uint)lVar10);
              }
              break;
            case 0xb:
              if (-1 < iVar5) {
                psVar6 = psVar4 + uVar12 + 2;
                lVar10 = 0;
                do {
                  sVar2 = data[uVar11 + lVar10];
                  *psVar6 = sVar2;
                  psVar6[-1] = sVar2;
                  psVar6[-2] = sVar2;
                  lVar10 = lVar10 + 1;
                  psVar6 = psVar6 + 3;
                } while (x != (uint)lVar10);
              }
              break;
            case 0xc:
              if (-1 < iVar5) {
                lVar10 = 0;
                do {
                  auVar13._8_8_ = 0;
                  auVar13._0_8_ = (ulong)data[uVar11 + lVar10] | 0xffff0000;
                  auVar13 = pshuflw(auVar13,auVar13,0x40);
                  *(long *)(psVar4 + uVar12 + lVar10 * 4) = auVar13._0_8_;
                  lVar10 = lVar10 + 1;
                } while (x != (uint)lVar10);
              }
              break;
            default:
              goto switchD_00134b42_caseD_d;
            case 0x11:
              if (-1 < iVar5) {
                lVar10 = 0;
                do {
                  psVar4[uVar12 + lVar10] = data[uVar11 + lVar10 * 2];
                  lVar10 = lVar10 + 1;
                } while (x != (uint)lVar10);
              }
              break;
            case 0x13:
              if (-1 < iVar5) {
                psVar6 = psVar4 + uVar12 + 2;
                lVar10 = 0;
                do {
                  sVar2 = data[uVar11 + lVar10 * 2];
                  *psVar6 = sVar2;
                  psVar6[-1] = sVar2;
                  psVar6[-2] = sVar2;
                  lVar10 = lVar10 + 1;
                  psVar6 = psVar6 + 3;
                } while (x != (uint)lVar10);
              }
              break;
            case 0x14:
              if (-1 < iVar5) {
                lVar10 = 0;
                do {
                  auVar13 = pshuflw(ZEXT416(*(uint *)(data + uVar11 + lVar10 * 2)),
                                    ZEXT416(*(uint *)(data + uVar11 + lVar10 * 2)),0x40);
                  *(long *)(psVar4 + uVar12 + lVar10 * 4) = auVar13._0_8_;
                  lVar10 = lVar10 + 1;
                } while (x != (uint)lVar10);
              }
              break;
            case 0x19:
              if (-1 < iVar5) {
                lVar10 = 0;
                do {
                  uVar1 = puVar7[2];
                  psVar4[uVar12 + lVar10] =
                       (stbi__uint16)
                       ((uint)uVar1 * 2 + ((uint)uVar1 + (uint)uVar1 * 8) * 3 +
                        (uint)puVar7[1] * 0x96 + (uint)*puVar7 * 0x4d >> 8);
                  lVar10 = lVar10 + 1;
                  puVar7 = puVar7 + 3;
                } while (x != (uint)lVar10);
              }
              break;
            case 0x1a:
              if (-1 < iVar5) {
                lVar10 = 0;
                do {
                  uVar1 = puVar7[2];
                  psVar4[uVar12 + lVar10 * 2] =
                       (stbi__uint16)
                       ((uint)uVar1 * 2 + ((uint)uVar1 + (uint)uVar1 * 8) * 3 +
                        (uint)puVar7[1] * 0x96 + (uint)*puVar7 * 0x4d >> 8);
                  psVar4[uVar12 + lVar10 * 2 + 1] = 0xffff;
                  lVar10 = lVar10 + 1;
                  puVar7 = puVar7 + 3;
                } while (x != (uint)lVar10);
              }
              break;
            case 0x1c:
              if (-1 < iVar5) {
                lVar10 = 0;
                do {
                  *(undefined4 *)(psVar4 + uVar12 + lVar10 * 4) = *(undefined4 *)puVar7;
                  psVar4[uVar12 + lVar10 * 4 + 2] = puVar7[2];
                  psVar4[uVar12 + lVar10 * 4 + 3] = 0xffff;
                  lVar10 = lVar10 + 1;
                  puVar7 = puVar7 + 3;
                } while (x != (uint)lVar10);
              }
              break;
            case 0x21:
              if (-1 < iVar5) {
                lVar10 = 0;
                do {
                  uVar1 = data[uVar11 + lVar10 * 4 + 2];
                  psVar4[uVar12 + lVar10] =
                       (stbi__uint16)
                       ((uint)uVar1 * 2 + ((uint)uVar1 + (uint)uVar1 * 8) * 3 +
                        (uint)data[uVar11 + lVar10 * 4 + 1] * 0x96 +
                        (uint)data[uVar11 + lVar10 * 4] * 0x4d >> 8);
                  lVar10 = lVar10 + 1;
                } while (x != (uint)lVar10);
              }
              break;
            case 0x22:
              if (-1 < iVar5) {
                lVar10 = 0;
                do {
                  uVar1 = data[uVar11 + lVar10 * 4 + 2];
                  psVar4[uVar12 + lVar10 * 2] =
                       (stbi__uint16)
                       ((uint)uVar1 * 2 + ((uint)uVar1 + (uint)uVar1 * 8) * 3 +
                        (uint)data[uVar11 + lVar10 * 4 + 1] * 0x96 +
                        (uint)data[uVar11 + lVar10 * 4] * 0x4d >> 8);
                  psVar4[uVar12 + lVar10 * 2 + 1] = data[uVar11 + lVar10 * 4 + 3];
                  lVar10 = lVar10 + 1;
                } while (x != (uint)lVar10);
              }
            }
          }
          else {
switchD_00134b42_caseD_d:
            if (-1 < iVar5) {
              psVar6 = psVar4 + (uint)(iVar9 * req_comp);
              lVar10 = 0;
              do {
                *(undefined4 *)psVar6 = *(undefined4 *)(data + uVar11 + lVar10 * 4);
                psVar6[2] = data[uVar11 + lVar10 * 4 + 2];
                lVar10 = lVar10 + 1;
                psVar6 = psVar6 + 3;
              } while (x != (uint)lVar10);
            }
          }
          uVar8 = uVar8 + 1;
          uVar12 = (ulong)((int)uVar12 + req_comp * x);
          uVar11 = (ulong)((int)uVar11 + x * img_n);
        } while (uVar8 != y);
      }
      free(data);
    }
  }
  return psVar4;
}

Assistant:

static stbi__uint16 *stbi__convert_format16(stbi__uint16 *data, int img_n, int req_comp, unsigned int x, unsigned int y)
{
   int i,j;
   stbi__uint16 *good;

   if (req_comp == img_n) return data;
   STBI_ASSERT(req_comp >= 1 && req_comp <= 4);

   good = (stbi__uint16 *) stbi__malloc(req_comp * x * y * 2);
   if (good == NULL) {
      STBI_FREE(data);
      return (stbi__uint16 *) stbi__errpuc("outofmem", "Out of memory");
   }

   for (j=0; j < (int) y; ++j) {
      stbi__uint16 *src  = data + j * x * img_n   ;
      stbi__uint16 *dest = good + j * x * req_comp;

      #define STBI__COMBO(a,b)  ((a)*8+(b))
      #define STBI__CASE(a,b)   case STBI__COMBO(a,b): for(i=x-1; i >= 0; --i, src += a, dest += b)
      // convert source image with img_n components to one with req_comp components;
      // avoid switch per pixel, so use switch per scanline and massive macros
      switch (STBI__COMBO(img_n, req_comp)) {
         STBI__CASE(1,2) { dest[0]=src[0]; dest[1]=0xffff;                                     } break;
         STBI__CASE(1,3) { dest[0]=dest[1]=dest[2]=src[0];                                     } break;
         STBI__CASE(1,4) { dest[0]=dest[1]=dest[2]=src[0]; dest[3]=0xffff;                     } break;
         STBI__CASE(2,1) { dest[0]=src[0];                                                     } break;
         STBI__CASE(2,3) { dest[0]=dest[1]=dest[2]=src[0];                                     } break;
         STBI__CASE(2,4) { dest[0]=dest[1]=dest[2]=src[0]; dest[3]=src[1];                     } break;
         STBI__CASE(3,4) { dest[0]=src[0];dest[1]=src[1];dest[2]=src[2];dest[3]=0xffff;        } break;
         STBI__CASE(3,1) { dest[0]=stbi__compute_y_16(src[0],src[1],src[2]);                   } break;
         STBI__CASE(3,2) { dest[0]=stbi__compute_y_16(src[0],src[1],src[2]); dest[1] = 0xffff; } break;
         STBI__CASE(4,1) { dest[0]=stbi__compute_y_16(src[0],src[1],src[2]);                   } break;
         STBI__CASE(4,2) { dest[0]=stbi__compute_y_16(src[0],src[1],src[2]); dest[1] = src[3]; } break;
         STBI__CASE(4,3) { dest[0]=src[0];dest[1]=src[1];dest[2]=src[2];                       } break;
         default: STBI_ASSERT(0); STBI_FREE(data); STBI_FREE(good); return (stbi__uint16*) stbi__errpuc("unsupported", "Unsupported format conversion");
      }
      #undef STBI__CASE
   }

   STBI_FREE(data);
   return good;
}